

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeBasisFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,char *filename,NameSet *rowNames,NameSet *colNames,bool cpxFormat)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  VarStatus VVar4;
  VarStatus *pVVar5;
  bool bVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  ofstream file;
  undefined8 uStack_220;
  byte abStack_218 [8];
  int aiStack_210 [120];
  
  if (this->_isRealLPLoaded == true) {
    bVar6 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::writeBasisFile(&this->_solver,filename,rowNames,colNames,cpxFormat);
    return bVar6;
  }
  std::ofstream::ofstream(&file,filename,_S_out);
  iVar1 = *(int *)((long)aiStack_210 + *(long *)(_file + -0x18));
  if (iVar1 == 0) {
    abStack_218[*(long *)(_file + -0x18)] = abStack_218[*(long *)(_file + -0x18)] | 0x20;
    poVar7 = std::operator<<((ostream *)&file,"NAME  ");
    poVar7 = std::operator<<(poVar7,filename);
    std::operator<<(poVar7,"\n");
    if (this->_hasBasis == false) {
      std::operator<<((ostream *)&file,"ENDATA\n");
    }
    else {
      iVar2 = (this->_basisStatusRows).thesize;
      uVar3 = (this->_basisStatusCols).thesize;
      uVar13 = 0;
      uVar8 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar8 = uVar13;
      }
      iVar10 = 0;
      for (; uVar13 != uVar8; uVar13 = uVar13 + 1) {
        VVar4 = (this->_basisStatusCols).data[uVar13];
        if (VVar4 == ON_UPPER) {
          std::operator<<((ostream *)&file," UL ");
          *(undefined8 *)((long)&uStack_220 + *(long *)(_file + -0x18)) = 8;
          if ((colNames == (NameSet *)0x0) || ((long)(colNames->set).thenum <= (long)uVar13)) {
            poVar7 = std::operator<<((ostream *)&file,"x");
            std::ostream::operator<<((ostream *)poVar7,(int)uVar13);
          }
          else {
            std::operator<<((ostream *)&file,
                            colNames->mem +
                            (colNames->set).theitem[(colNames->set).thekey[uVar13].idx].data);
          }
          std::operator<<((ostream *)&file,"\n");
        }
        else if (VVar4 == BASIC) {
          pVVar5 = (this->_basisStatusRows).data;
          lVar9 = (long)iVar10;
          iVar11 = iVar2;
          if (iVar2 < iVar10) {
            iVar11 = iVar10;
          }
          for (; lVar9 < iVar2; lVar9 = lVar9 + 1) {
            if (pVVar5[lVar9] != BASIC) {
              iVar11 = (int)lVar9;
              break;
            }
          }
          pcVar12 = " XL ";
          if ((pVVar5[iVar11] == ON_UPPER) &&
             ((!cpxFormat || (pcVar12 = " XL ", (this->_rowTypes).data[iVar11] == RANGETYPE_BOXED)))
             ) {
            pcVar12 = " XU ";
          }
          std::operator<<((ostream *)&file,pcVar12);
          *(undefined8 *)((long)&uStack_220 + *(long *)(_file + -0x18)) = 8;
          if ((colNames == (NameSet *)0x0) || ((long)(colNames->set).thenum <= (long)uVar13)) {
            poVar7 = std::operator<<((ostream *)&file,"x");
            std::ostream::operator<<((ostream *)poVar7,(int)uVar13);
          }
          else {
            std::operator<<((ostream *)&file,
                            colNames->mem +
                            (colNames->set).theitem[(colNames->set).thekey[uVar13].idx].data);
          }
          std::operator<<((ostream *)&file,"       ");
          if (((rowNames == (NameSet *)0x0) || (iVar11 < 0)) || ((rowNames->set).thenum <= iVar11))
          {
            poVar7 = std::operator<<((ostream *)&file,"C");
            std::ostream::operator<<((ostream *)poVar7,iVar11);
          }
          else {
            std::operator<<((ostream *)&file,
                            rowNames->mem +
                            (rowNames->set).theitem[(rowNames->set).thekey[iVar11].idx].data);
          }
          std::operator<<((ostream *)&file,"\n");
          iVar10 = iVar11 + 1;
        }
      }
      std::operator<<((ostream *)&file,"ENDATA\n");
    }
  }
  std::ofstream::~ofstream(&file);
  return iVar1 == 0;
}

Assistant:

bool SoPlexBase<R>::writeBasisFile(const char* filename, const NameSet* rowNames,
                                   const NameSet* colNames, const bool cpxFormat) const
{
   assert(filename != nullptr);

   if(_isRealLPLoaded)
      return _solver.writeBasisFile(filename, rowNames, colNames, cpxFormat);
   else
   {
      std::ofstream file(filename);

      if(!file.good())
         return false;

      file.setf(std::ios::left);
      file << "NAME  " << filename << "\n";

      // do not write basis if there is none
      if(!_hasBasis)
      {
         file << "ENDATA\n";
         return true;
      }

      // start writing
      int numRows = _basisStatusRows.size();
      int numCols = _basisStatusCols.size();
      int row = 0;

      for(int col = 0; col < numCols; col++)
      {
         assert(_basisStatusCols[col] != SPxSolverBase<R>::UNDEFINED);

         if(_basisStatusCols[col] == SPxSolverBase<R>::BASIC)
         {
            // find nonbasic row
            for(; row < numRows; row++)
            {
               assert(_basisStatusRows[row] != SPxSolverBase<R>::UNDEFINED);

               if(_basisStatusRows[row] != SPxSolverBase<R>::BASIC)
                  break;
            }

            assert(row != numRows);

            if(_basisStatusRows[row] == SPxSolverBase<R>::ON_UPPER && (!cpxFormat
                  || _rowTypes[row] == SoPlexBase<R>::RANGETYPE_BOXED))
               file << " XU ";
            else
               file << " XL ";

            file << std::setw(8);

            if(colNames != nullptr && colNames->has(col))
               file << (*colNames)[col];
            else
               file << "x" << col;

            file << "       ";

            if(rowNames != nullptr && rowNames->has(row))
               file << (*rowNames)[row];
            else
               file << "C" << row;

            file << "\n";
            row++;
         }
         else
         {
            if(_basisStatusCols[col] == SPxSolverBase<R>::ON_UPPER)
            {
               file << " UL ";

               file << std::setw(8);

               if(colNames != nullptr && colNames->has(col))
                  file << (*colNames)[col];
               else
                  file << "x" << col;

               file << "\n";
            }
         }
      }

      file << "ENDATA\n";

#ifndef NDEBUG

      // check that the remaining rows are basic
      for(; row < numRows; row++)
      {
         assert(_basisStatusRows[row] == SPxSolverBase<R>::BASIC);
      }

#endif

      return true;
   }
}